

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int read_line(lua_State *L,FILE *f)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  luaL_Buffer local_2038;
  
  __s = local_2038.buffer;
  local_2038.lvl = 0;
  local_2038.p = __s;
  local_2038.L = L;
  while( true ) {
    iVar1 = emptybuffer(&local_2038);
    if (iVar1 != 0) {
      adjuststack(&local_2038);
    }
    pcVar2 = fgets(__s,0x2000,(FILE *)f);
    if (pcVar2 == (char *)0x0) break;
    sVar3 = strlen(__s);
    if ((sVar3 != 0) && (local_2038.buffer[sVar3 - 1] == '\n')) {
      local_2038.p = local_2038.p + (sVar3 - 1);
      emptybuffer(&local_2038);
      lua_concat(local_2038.L,local_2038.lvl);
      return 1;
    }
    local_2038.p = local_2038.p + sVar3;
  }
  emptybuffer(&local_2038);
  lua_concat(local_2038.L,local_2038.lvl);
  local_2038.lvl = 1;
  sVar4 = lua_objlen(L,-1);
  return (uint)(sVar4 != 0);
}

Assistant:

static int read_line(lua_State*L,FILE*f){
luaL_Buffer b;
luaL_buffinit(L,&b);
for(;;){
size_t l;
char*p=luaL_prepbuffer(&b);
if(fgets(p,BUFSIZ,f)==NULL){
luaL_pushresult(&b);
return(lua_objlen(L,-1)>0);
}
l=strlen(p);
if(l==0||p[l-1]!='\n')
luaL_addsize(&b,l);
else{
luaL_addsize(&b,l-1);
luaL_pushresult(&b);
return 1;
}
}
}